

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.hpp
# Opt level: O2

size_t interp_compress(uint8_t *obuff,size_t osize,uint32_t *ibuff,size_t isize)

{
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  uint uVar4;
  size_t sVar5;
  uint uVar6;
  uint64_t v;
  long lVar7;
  size_type __n;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  allocator_type local_41;
  vector<unsigned_long,_std::allocator<unsigned_long>_> T;
  
  __n = isize * 2 - 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&T,__n,&local_41);
  for (sVar5 = 0; isize != sVar5; sVar5 = sVar5 + 1) {
    T.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[isize + (sVar5 - 1)] = (ulong)ibuff[sVar5];
  }
  uVar6 = (int)isize * 2 - 4;
  for (uVar4 = (int)isize - 2; -1 < (int)uVar4; uVar4 = uVar4 - 1) {
    uVar1 = uVar6 + 1;
    uVar8 = (ulong)uVar6;
    uVar6 = uVar6 - 2;
    __n = (T.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[uVar1] - 1) +
          T.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar8 + 2];
    T.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar4] = __n;
  }
  sVar5 = byte_encode(obuff,__n,
                      *T.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start,0x8000000000000000);
  lVar7 = isize - 1;
  lVar9 = 4;
  while (bVar10 = lVar7 != 0, lVar7 = lVar7 + -1, bVar10) {
    uVar8 = *(ulong *)((long)T.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar9 * 2 + 8);
    uVar2 = *(ulong *)((long)T.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar9 * 2);
    v = (uVar8 - uVar2) + 1;
    if (uVar8 < uVar2) {
      v = -(uVar8 - uVar2);
    }
    sVar3 = byte_encode(obuff + sVar5,-(uVar8 - uVar2),v,
                        *(uint64_t *)
                         ((long)T.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar9 + -4));
    sVar5 = sVar5 + sVar3;
    lVar9 = lVar9 + 8;
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&T.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return sVar5;
}

Assistant:

size_t interp_compress(uint8_t* obuff, /* output buffer */
    size_t osize, /* output buffer size */
    const uint32_t* ibuff, /* input buffer */
    size_t isize)
{ /* input buffer size */

    int i, p;
    uint64_t vp, vl, vr, v;
    size_t op = 0;

    std::vector<uint64_t> T(2 * isize - 1);

    for (i = 0; i < isize; i++) {
        T[i + isize - 1] = ibuff[i];
    }
    for (p = isize - 2; p >= 0; p--) {
        T[p] = T[2 * p + 1] + T[2 * p + 2] - 1;
    }
    op += byte_encode(obuff, osize - op, T[0], (1LL << 63));
    for (p = 0; p < isize - 1; p++) {
        vp = T[p];
        vl = T[2 * p + 1];
        vr = T[2 * p + 2];
        if (vl <= vr) {
            v = vr - vl + 1;
        } else {
            v = vl - vr;
        }
        op += byte_encode(obuff + op, osize - op, v, vp);
    }
    return op;
}